

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

int evfilt_timer_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  uintptr_t uVar1;
  void *pvVar2;
  short sVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  uint64_t expired;
  intptr_t local_20;
  
  uVar1 = (src->kev).ident;
  sVar3 = (src->kev).filter;
  uVar4 = (src->kev).flags;
  uVar5 = (src->kev).fflags;
  pvVar2 = (src->kev).udata;
  dst->data = (src->kev).data;
  dst->udata = pvVar2;
  dst->ident = uVar1;
  dst->filter = sVar3;
  dst->flags = uVar4;
  dst->fflags = uVar5;
  if ((*ptr & 8) != 0) {
    dst->fflags = 1;
  }
  sVar7 = read((src->field_10).kn_timerfd,&local_20,8);
  if (sVar7 != 8) {
    local_20 = 1;
  }
  dst->data = local_20;
  iVar6 = 0;
  if (((src->kev).flags & 0x80) != 0) {
    iVar6 = knote_disable(filt,src);
  }
  if (((src->kev).flags & 0x10) != 0) {
    iVar6 = knote_delete(filt,src);
  }
  return iVar6 >> 0x1f | 1;
}

Assistant:

int
evfilt_timer_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    struct epoll_event * const ev = (struct epoll_event *) ptr;
    uint64_t expired;
    ssize_t n;

    memcpy(dst, &src->kev, sizeof(*dst));
    if (ev->events & EPOLLERR)
        dst->fflags = 1; /* FIXME: Return the actual timer error */

    /* On return, data contains the number of times the
       timer has been trigered.
     */
    n = read(src->kn_timerfd, &expired, sizeof(expired));
    if (n != sizeof(expired)) {
        dbg_puts("invalid read from timerfd");
        expired = 1;  /* Fail gracefully */
    }
    dst->data = expired;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}